

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

int get8_packet_raw(vorb *f)

{
  uint8 uVar1;
  byte bVar2;
  int iVar3;
  
  uVar1 = f->bytes_in_seg;
  if (uVar1 == '\0') {
    if (f->last_seg != 0) {
      return -1;
    }
    iVar3 = next_segment(f);
    if (iVar3 == 0) {
      return -1;
    }
    uVar1 = f->bytes_in_seg;
  }
  f->bytes_in_seg = uVar1 + 0xff;
  f->packet_bytes = f->packet_bytes + 1;
  bVar2 = get8(f);
  return (uint)bVar2;
}

Assistant:

static int get8_packet_raw(vorb *f)
{
   if (!f->bytes_in_seg) {  // CLANG!
      if (f->last_seg) return EOP;
      else if (!next_segment(f)) return EOP;
   }
   assert(f->bytes_in_seg > 0);
   --f->bytes_in_seg;
   ++f->packet_bytes;
   return get8(f);
}